

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoCube>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoCube> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZGeoCube> *cp)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  long lVar8;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016ba530;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016ba188,DestMesh,&cp->super_TPZGeoEl);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016b9e88;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_016b2fe8;
  iVar1 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[1];
  iVar2 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[2];
  iVar3 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[3];
  iVar4 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[4];
  iVar5 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[5];
  iVar6 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[6];
  iVar7 = (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[7];
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[0] =
       (cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[0];
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[1] = iVar1;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[2] = iVar2;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[3] = iVar3;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[4] = iVar4;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[5] = iVar5;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[6] = iVar6;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[7] = iVar7;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoCube_016b2f60;
  lVar8 = 0x98;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + lVar8 + -0x58) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + lVar8 + -0x48) =
         0xffffffff;
    *(undefined8 *)((long)(&this->fGeo + -1) + lVar8) = 0xffffffffffffffff;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 800);
  for (lVar8 = 0x98; lVar8 != 800; lVar8 = lVar8 + 0x18) {
    *(undefined8 *)((long)(&this->fGeo + -1) + lVar8) =
         *(undefined8 *)((long)(&cp->fGeo + -1) + lVar8);
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + lVar8 + -0x48) =
         *(undefined4 *)
          ((long)(cp->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + lVar8 + -0x48);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZGeoMesh &DestMesh, const TPZGeoElRefLess &cp):
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp), fGeo(cp.fGeo,DestMesh) {
	int i;
	const int n = TGeo::NSides;
	for(i = 0; i < n; i++){
		this->fNeighbours[i] = cp.fNeighbours[i];
	}
}